

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O2

void __thiscall
cornerstone::raft_server::on_snapshot_completed
          (raft_server *this,ptr<snapshot> *s,bool result,ptr<std::exception> *err)

{
  element_type *peVar1;
  element_type *peVar2;
  char *pcVar3;
  string *this_00;
  allocator<char> local_111;
  string local_110 [32];
  strfmt<200> local_f0;
  
  peVar1 = (err->super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    if (result) {
      std::recursive_mutex::lock(&this->lock_);
      peVar2 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      std::__cxx11::string::string<std::allocator<char>>
                (local_110 + 0x20,"snapshot created, compact the log store",
                 (allocator<char> *)local_110);
      (*peVar2->_vptr_logger[2])(peVar2,local_110 + 0x20);
      std::__cxx11::string::~string(local_110 + 0x20);
      std::__shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->last_snapshot_).
                  super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>,
                 &s->super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>);
      if ((ulong)(long)*(int *)((long)(((this->ctx_)._M_t.
                                        super___uniq_ptr_impl<cornerstone::context,_std::default_delete<cornerstone::context>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cornerstone::context_*,_std::default_delete<cornerstone::context>_>
                                        .super__Head_base<0UL,_cornerstone::context_*,_false>.
                                       _M_head_impl)->params_)._M_t.
                                      super___uniq_ptr_impl<cornerstone::raft_params,_std::default_delete<cornerstone::raft_params>_>
                               + 0x24) <
          ((s->super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
          last_log_idx_) {
        (*((this->log_store_).super___shared_ptr<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr)->_vptr_log_store[0xc])();
      }
      pthread_mutex_unlock((pthread_mutex_t *)&this->lock_);
      goto LAB_0013f84c;
    }
    peVar2 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string<std::allocator<char>>
              (local_110 + 0x20,"the state machine rejects to create the snapshot",
               (allocator<char> *)local_110);
    (*peVar2->_vptr_logger[3])(peVar2,local_110 + 0x20);
    this_00 = local_110 + 0x20;
  }
  else {
    peVar2 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_f0.fmt_ = "failed to create a snapshot due to %s";
    pcVar3 = (char *)(**(code **)(*(long *)peVar1 + 0x10))();
    pcVar3 = strfmt<200>::fmt<char_const*>((strfmt<200> *)(local_110 + 0x20),pcVar3);
    std::__cxx11::string::string<std::allocator<char>>(local_110,pcVar3,&local_111);
    (*peVar2->_vptr_logger[5])(peVar2,local_110);
    this_00 = local_110;
  }
  std::__cxx11::string::~string(this_00);
LAB_0013f84c:
  LOCK();
  (this->snp_in_progress_)._M_base._M_i = false;
  UNLOCK();
  return;
}

Assistant:

void raft_server::on_snapshot_completed(ptr<snapshot>& s, bool result, const ptr<std::exception>& err)
{
    do
    {
        if (err != nilptr)
        {
            l_->err(lstrfmt("failed to create a snapshot due to %s").fmt(err->what()));
            break;
        }

        if (!result)
        {
            l_->info("the state machine rejects to create the snapshot");
            break;
        }

        {
            recur_lock(lock_);
            l_->debug("snapshot created, compact the log store");

            last_snapshot_ = s;
            if (s->get_last_log_idx() > (ulong)ctx_->params_->reserved_log_items_)
            {
                log_store_->compact(s->get_last_log_idx() - (ulong)ctx_->params_->reserved_log_items_);
            }
        }
    } while (false);
    snp_in_progress_.store(false);
}